

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void CVmObjBigNum::compute_sinhcosh_into(char *dst,char *src,int is_cosh,int is_tanh)

{
  uint uVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long *plVar4;
  int in_ECX;
  int in_EDX;
  err_frame_t err_cur__;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *ext;
  int round;
  char *src_00;
  char *dst_00;
  unsigned_long *remp;
  undefined4 in_stack_fffffffffffffecc;
  char *ext_00;
  void *local_128;
  char local_58 [8];
  unsigned_long *local_50;
  undefined1 local_48 [8];
  unsigned_long *local_40;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  sVar2 = get_prec((char *)0x2ba513);
  ext = &stack0xffffffffffffffcc;
  src_00 = local_58;
  dst_00 = &stack0xffffffffffffffc8;
  alloc_temp_regs(sVar2 + 3,4,&local_40,&stack0xffffffffffffffd4,local_48,&stack0xffffffffffffffd0,
                  &local_50);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  ext_00 = (char *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&stack0xfffffffffffffec8;
  uVar1 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffee0);
  if (uVar1 == 0) {
    compute_exp_into((char *)err_cur__.jmpbuf_[0].__saved_mask.__val[1],
                     (char *)err_cur__.jmpbuf_[0].__saved_mask.__val[0]);
    remp = local_50;
    get_one();
    copy_val(dst_00,src_00,(int)((ulong)ext >> 0x20));
    compute_quotient_into
              ((char *)err_cur__.jmpbuf_[0].__jmpbuf[3],(char *)err_cur__.jmpbuf_[0].__jmpbuf[2],
               (char *)err_cur__.jmpbuf_[0].__jmpbuf[1],(char *)err_cur__.jmpbuf_[0].__jmpbuf[0]);
    if (in_ECX == 0) {
      if (in_EDX == 0) {
        negate(ext);
      }
      compute_sum_into(dst_00,src_00,ext);
      round = (int)((ulong)ext >> 0x20);
      div_by_long(ext_00,CONCAT44(in_stack_fffffffffffffecc,uVar1),remp);
    }
    else {
      compute_sum_into(dst_00,src_00,ext);
      negate(ext);
      compute_sum_into(dst_00,src_00,ext);
      round = (int)((ulong)ext >> 0x20);
      compute_quotient_into
                ((char *)err_cur__.jmpbuf_[0].__jmpbuf[3],(char *)err_cur__.jmpbuf_[0].__jmpbuf[2],
                 (char *)err_cur__.jmpbuf_[0].__jmpbuf[1],(char *)err_cur__.jmpbuf_[0].__jmpbuf[0]);
      local_50 = local_40;
    }
    copy_val(dst_00,src_00,round);
  }
  if ((uVar1 & 0x8000) == 0) {
    release_temp_regs(4,(ulong)in_stack_ffffffffffffffd4,(ulong)in_stack_ffffffffffffffd0,
                      (ulong)in_stack_ffffffffffffffcc,(ulong)in_stack_ffffffffffffffc8);
  }
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = ext_00;
  if ((uVar1 & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = local_128;
    err_rethrow();
  }
  if ((uVar1 & 2) != 0) {
    free(local_128);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sinhcosh_into(char *dst, const char *src,
                                         int is_cosh, int is_tanh)
{
    size_t prec = get_prec(dst);
    uint hdl1, hdl2, hdl3, hdl4;
    char *ext1, *ext2, *ext3, *ext4;
    
    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 4,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4);
    
    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* 
         *   sinh(x) = (e^x - e^(-x))/2
         *   
         *   cosh(x) = (e^x + e^(-x))/2
         *   
         *   The two differ only in the sign of the e^(-x) term, so most
         *   of the calculation is the same for both.  
         */
        
        /* compute e^x into r1 */
        compute_exp_into(ext1, src);

        /* 
         *   rather than calculating e^-x separately, simply invert our
         *   e^x value to yield e^-x (a simple division is much quicker
         *   than calculating another exponent, which involves an entire
         *   taylor series expansion) 
         */
        copy_val(ext3, get_one(), FALSE);
        compute_quotient_into(ext2, 0, ext3, ext1);

        /* 
         *   if we're calculating the tanh, we'll want both the sinh and
         *   cosh values 
         */
        if (is_tanh)
        {
            /* add the terms to get the cosh */
            compute_sum_into(ext4, ext1, ext2);

            /* subtract ext2 to get the sinh */
            negate(ext2);
            compute_sum_into(ext3, ext1, ext2);

            /* tanh is the quotient of sinh/cosh */
            compute_quotient_into(ext1, 0, ext3, ext4);

            /* our result is in ext1 - set ext3 to point there */
            ext3 = ext1;
        }
        else
        {
            /* 
             *   if this is sinh, the e^-x term is subtracted; if it's
             *   cosh, it's added 
             */
            if (!is_cosh)
                negate(ext2);
        
            /* compute r1 + r2 into r3 (e^x +/- e^(-x)) */
            compute_sum_into(ext3, ext1, ext2);
        
            /* halve the result */
            div_by_long(ext3, 2);
        }
        
        /* store the result */
        copy_val(dst, ext3, TRUE);
    }